

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Char * poolCopyString(STRING_POOL *pool,XML_Char *s)

{
  char cVar1;
  XML_Char *pXVar2;
  int iVar3;
  char *pcVar4;
  
  do {
    pcVar4 = pool->ptr;
    if (pcVar4 == pool->end) {
      iVar3 = poolGrow(pool);
      if (iVar3 == 0) {
        return (XML_Char *)0x0;
      }
      pcVar4 = pool->ptr;
    }
    cVar1 = *s;
    pool->ptr = pcVar4 + 1;
    *pcVar4 = cVar1;
    cVar1 = *s;
    s = s + 1;
  } while (cVar1 != '\0');
  pXVar2 = pool->start;
  pool->start = pool->ptr;
  return pXVar2;
}

Assistant:

static const XML_Char *poolCopyString(STRING_POOL *pool, const XML_Char *s)
{
  do {
    if (!poolAppendChar(pool, *s))
      return 0;
  } while (*s++);
  s = pool->start;
  poolFinish(pool);
  return s;
}